

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

int glu::getDataTypeMatrixNumRows(DataType dataType)

{
  int local_c;
  DataType dataType_local;
  
  switch(dataType) {
  case TYPE_FLOAT_MAT2:
    local_c = 2;
    break;
  case TYPE_FLOAT_MAT2X3:
    local_c = 3;
    break;
  case TYPE_FLOAT_MAT2X4:
    local_c = 4;
    break;
  case TYPE_FLOAT_MAT3X2:
    local_c = 2;
    break;
  case TYPE_FLOAT_MAT3:
    local_c = 3;
    break;
  case TYPE_FLOAT_MAT3X4:
    local_c = 4;
    break;
  case TYPE_FLOAT_MAT4X2:
    local_c = 2;
    break;
  case TYPE_FLOAT_MAT4X3:
    local_c = 3;
    break;
  case TYPE_FLOAT_MAT4:
    local_c = 4;
    break;
  default:
    local_c = 0;
    break;
  case TYPE_DOUBLE_MAT2:
    local_c = 2;
    break;
  case TYPE_DOUBLE_MAT2X3:
    local_c = 3;
    break;
  case TYPE_DOUBLE_MAT2X4:
    local_c = 4;
    break;
  case TYPE_DOUBLE_MAT3X2:
    local_c = 2;
    break;
  case TYPE_DOUBLE_MAT3:
    local_c = 3;
    break;
  case TYPE_DOUBLE_MAT3X4:
    local_c = 4;
    break;
  case TYPE_DOUBLE_MAT4X2:
    local_c = 2;
    break;
  case TYPE_DOUBLE_MAT4X3:
    local_c = 3;
    break;
  case TYPE_DOUBLE_MAT4:
    local_c = 4;
  }
  return local_c;
}

Assistant:

int getDataTypeMatrixNumRows (DataType dataType)
{
	switch (dataType)
	{
		case TYPE_FLOAT_MAT2:		return 2;
		case TYPE_FLOAT_MAT2X3:		return 3;
		case TYPE_FLOAT_MAT2X4:		return 4;
		case TYPE_FLOAT_MAT3X2:		return 2;
		case TYPE_FLOAT_MAT3:		return 3;
		case TYPE_FLOAT_MAT3X4:		return 4;
		case TYPE_FLOAT_MAT4X2:		return 2;
		case TYPE_FLOAT_MAT4X3:		return 3;
		case TYPE_FLOAT_MAT4:		return 4;
		case TYPE_DOUBLE_MAT2:		return 2;
		case TYPE_DOUBLE_MAT2X3:	return 3;
		case TYPE_DOUBLE_MAT2X4:	return 4;
		case TYPE_DOUBLE_MAT3X2:	return 2;
		case TYPE_DOUBLE_MAT3:		return 3;
		case TYPE_DOUBLE_MAT3X4:	return 4;
		case TYPE_DOUBLE_MAT4X2:	return 2;
		case TYPE_DOUBLE_MAT4X3:	return 3;
		case TYPE_DOUBLE_MAT4:		return 4;
		default:
			DE_ASSERT(false);
			return 0;
	}
}